

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-status.c
# Opt level: O0

char * labpack_status_string(labpack_status_t status)

{
  char *pcStack_10;
  labpack_status_t status_local;
  
  switch(status) {
  case LABPACK_STATUS_OK:
    pcStack_10 = "No Error";
    break;
  case LABPACK_STATUS_ERROR_OUT_OF_MEMORY:
    pcStack_10 = "Out of Memory Error";
    break;
  case LABPACK_STATUS_ERROR_NULL_VALUE:
    pcStack_10 = "Null Value Error";
    break;
  case LABPACK_STATUS_ERROR_ENCODER:
    pcStack_10 = "Encoder Error";
    break;
  case LABPACK_STATUS_ERROR_DECODER:
    pcStack_10 = "Decoder Error";
    break;
  default:
    if (UNKNOWN_STATUS == (char *)0x0) {
      __assert_fail("UNKNOWN_STATUS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-status.c"
                    ,0x3e,"const char *labpack_status_string(labpack_status_t)");
    }
    pcStack_10 = UNKNOWN_STATUS;
  }
  return pcStack_10;
}

Assistant:

const char*
labpack_status_string(labpack_status_t status) {
    switch (status) {
        case LABPACK_STATUS_OK: return "No Error";
        case LABPACK_STATUS_ERROR_OUT_OF_MEMORY: return "Out of Memory Error";
        case LABPACK_STATUS_ERROR_NULL_VALUE: return "Null Value Error";
        case LABPACK_STATUS_ERROR_ENCODER: return "Encoder Error";
        case LABPACK_STATUS_ERROR_DECODER: return "Decoder Error";
        default: assert(UNKNOWN_STATUS);
    }
    return UNKNOWN_STATUS;
}